

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_script.cpp
# Opt level: O0

void __thiscall
cfdcapi_script_SingleKeyTaproot_Test::TestBody(cfdcapi_script_SingleKeyTaproot_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  char *pcVar3;
  char *message;
  char *in_R9;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  char *str_buffer;
  AssertionResult gtest_ar_10;
  int tmp_ret;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  char *tree_str;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  char *tweaked_privkey;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  char *control_block;
  char *leaf_hash;
  char *witness_program;
  AssertionResult gtest_ar_1;
  void *tree_handle;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  bool *in_stack_fffffffffffffbe8;
  AssertionResult *in_stack_fffffffffffffbf0;
  Secret *in_stack_fffffffffffffbf8;
  AssertionResult *pAVar4;
  undefined7 in_stack_fffffffffffffc00;
  undefined1 in_stack_fffffffffffffc07;
  void **in_stack_fffffffffffffc08;
  void *in_stack_fffffffffffffc28;
  char **in_stack_fffffffffffffc80;
  AssertionResult *in_stack_fffffffffffffc88;
  undefined7 in_stack_fffffffffffffca8;
  void **in_stack_fffffffffffffcd0;
  undefined7 in_stack_fffffffffffffcd8;
  undefined1 in_stack_fffffffffffffcdf;
  char *in_stack_fffffffffffffce0;
  AssertionResult *in_stack_fffffffffffffce8;
  AssertHelper local_2b0;
  Message local_2a8;
  undefined4 local_29c;
  AssertionResult local_298;
  AssertHelper local_288;
  Message local_280;
  AssertionResult local_278;
  AssertHelper local_268;
  Message local_260;
  undefined4 local_254;
  AssertionResult local_250;
  char *local_240;
  AssertHelper local_238;
  Message local_230;
  undefined4 local_224;
  AssertionResult local_220;
  int local_20c;
  AssertHelper local_208;
  Message local_200;
  AssertionResult local_1f8;
  AssertHelper local_1e8;
  Message local_1e0;
  undefined4 local_1d4;
  AssertionResult local_1d0;
  char *local_1c0;
  AssertHelper local_1b8;
  Message local_1b0;
  AssertionResult local_1a8;
  AssertHelper local_198;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  char **in_stack_fffffffffffffe80;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe88;
  void *in_stack_fffffffffffffe90;
  AssertHelper in_stack_fffffffffffffe98;
  Message local_160;
  AssertionResult local_158;
  AssertHelper local_148;
  Message local_140;
  AssertionResult local_138;
  AssertHelper local_128;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffef0;
  AssertHelper in_stack_fffffffffffffef8;
  Message local_100;
  undefined4 local_f4;
  AssertionResult local_f0;
  char *local_e0;
  undefined8 local_d8;
  char *local_d0;
  AssertHelper local_c8;
  Message local_c0;
  undefined4 local_b4;
  AssertionResult local_b0;
  undefined8 local_a0;
  string local_98;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_61;
  AssertionResult local_60;
  AssertHelper local_50;
  Message local_48 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  int local_14;
  long local_10;
  
  local_10 = 0;
  local_14 = CfdCreateHandle(in_stack_fffffffffffffc08);
  local_2c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffc08,
             (char *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
             (CfdErrorCode *)in_stack_fffffffffffffbf8,(int *)in_stack_fffffffffffffbf0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3b413a);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
               ,0x336,pcVar3);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x3b419d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b41f2);
  local_61 = local_10 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,(type *)0x3b4226);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_60,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
               ,0x337,pcVar3);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    testing::Message::~Message((Message *)0x3b4322);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b439d);
  local_a0 = 0;
  local_14 = CfdInitializeTaprootScriptTree
                       ((void *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                        in_stack_fffffffffffffcd0);
  local_b4 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffc08,
             (char *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
             (CfdErrorCode *)in_stack_fffffffffffffbf8,(int *)in_stack_fffffffffffffbf0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3b4472);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
               ,0x33b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::Message::~Message((Message *)0x3b44d5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b452d);
  if (local_14 == 0) {
    local_d0 = (char *)0x0;
    local_d8 = 0;
    local_e0 = (char *)0x0;
    local_14 = CfdGetTaprootScriptTreeHash
                         (in_stack_fffffffffffffe98.data_,in_stack_fffffffffffffe90,
                          (char *)in_stack_fffffffffffffe88.ptr_,in_stack_fffffffffffffe80,
                          (char **)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                          (char **)in_stack_fffffffffffffe70.ptr_);
    local_f4 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffc08,
               (char *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
               (CfdErrorCode *)in_stack_fffffffffffffbf8,(int *)in_stack_fffffffffffffbf0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f0);
    if (!bVar1) {
      testing::Message::Message(&local_100);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3b4647);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffef8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x349,pcVar3);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffef8,&local_100);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffef8);
      testing::Message::~Message((Message *)0x3b46aa);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b46ff);
    if (local_14 == 0) {
      in_stack_fffffffffffffce8 = (AssertionResult *)&stack0xfffffffffffffee8;
      testing::internal::CmpHelperSTREQ
                ((internal *)in_stack_fffffffffffffce8,
                 "\"cc3b1538e0c8144375f71e848b12d609d743992fddfc60dd6ca9b33b8392f27a\"",
                 "witness_program",
                 "cc3b1538e0c8144375f71e848b12d609d743992fddfc60dd6ca9b33b8392f27a",local_d0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffffce8);
      if (!bVar1) {
        testing::Message::Message((Message *)&stack0xfffffffffffffee0);
        in_stack_fffffffffffffce0 =
             testing::AssertionResult::failure_message((AssertionResult *)0x3b47ae);
        testing::internal::AssertHelper::AssertHelper
                  (&local_128,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x34d,in_stack_fffffffffffffce0);
        testing::internal::AssertHelper::operator=(&local_128,(Message *)&stack0xfffffffffffffee0);
        testing::internal::AssertHelper::~AssertHelper(&local_128);
        testing::Message::~Message((Message *)0x3b4811);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b4866);
      pAVar4 = &local_138;
      testing::internal::EqHelper<true>::Compare<char>
                ((char *)in_stack_fffffffffffffc08,
                 (char *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
                 in_stack_fffffffffffffbf8,&in_stack_fffffffffffffbf0->success_);
      in_stack_fffffffffffffcdf = testing::AssertionResult::operator_cast_to_bool(pAVar4);
      if (!(bool)in_stack_fffffffffffffcdf) {
        testing::Message::Message(&local_140);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3b4904);
        testing::internal::AssertHelper::AssertHelper
                  (&local_148,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x34e,pcVar3);
        testing::internal::AssertHelper::operator=(&local_148,&local_140);
        testing::internal::AssertHelper::~AssertHelper(&local_148);
        testing::Message::~Message((Message *)0x3b4967);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b49bc);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_158,
                 "\"c11777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb\"",
                 "control_block",
                 "c11777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",local_e0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_158);
      if (!bVar1) {
        testing::Message::Message(&local_160);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3b4a5d);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xfffffffffffffe98,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x351,pcVar3);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xfffffffffffffe98,&local_160);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffe98);
        testing::Message::~Message((Message *)0x3b4ac0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b4b15);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffffbf8);
      local_d0 = (char *)0x0;
      CfdFreeStringBuffer((char *)in_stack_fffffffffffffbf8);
      local_d8 = 0;
      CfdFreeStringBuffer((char *)in_stack_fffffffffffffbf8);
      local_e0 = (char *)0x0;
    }
    pcVar3 = (char *)0x0;
    local_14 = CfdGetTaprootTweakedPrivkey
                         (in_stack_fffffffffffffef8.data_,in_stack_fffffffffffffef0.ptr_,
                          in_stack_fffffffffffffee8,(char **)in_stack_fffffffffffffee0.ptr_);
    pAVar4 = (AssertionResult *)&stack0xfffffffffffffe80;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffc08,
               (char *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
               (CfdErrorCode *)in_stack_fffffffffffffbf8,(int *)in_stack_fffffffffffffbf0);
    uVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
    if (!(bool)uVar2) {
      testing::Message::Message((Message *)&stack0xfffffffffffffe70);
      message = testing::AssertionResult::failure_message((AssertionResult *)0x3b4c46);
      testing::internal::AssertHelper::AssertHelper
                (&local_198,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x35e,message);
      testing::internal::AssertHelper::operator=(&local_198,(Message *)&stack0xfffffffffffffe70);
      testing::internal::AssertHelper::~AssertHelper(&local_198);
      testing::Message::~Message((Message *)0x3b4ca9);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b4cfe);
    if (local_14 == 0) {
      in_stack_fffffffffffffc88 = &local_1a8;
      testing::internal::CmpHelperSTREQ
                ((internal *)in_stack_fffffffffffffc88,
                 "\"3a56ec9129732312a78db4b845138a3180c102621d7381ae6e6a5d530f14856a\"",
                 "tweaked_privkey",
                 "3a56ec9129732312a78db4b845138a3180c102621d7381ae6e6a5d530f14856a",pcVar3);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffffc88);
      if (!bVar1) {
        testing::Message::Message(&local_1b0);
        in_stack_fffffffffffffc80 =
             (char **)testing::AssertionResult::failure_message((AssertionResult *)0x3b4dad);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1b8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x362,(char *)in_stack_fffffffffffffc80);
        testing::internal::AssertHelper::operator=(&local_1b8,&local_1b0);
        testing::internal::AssertHelper::~AssertHelper(&local_1b8);
        testing::Message::~Message((Message *)0x3b4e10);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b4e65);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffffbf8);
    }
    local_1c0 = (char *)0x0;
    local_14 = CfdGetTaprootScriptTreeSrting
                         (in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
                          (char **)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8));
    local_1d4 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffc08,
               (char *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
               (CfdErrorCode *)in_stack_fffffffffffffbf8,(int *)in_stack_fffffffffffffbf0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1d0);
    if (!bVar1) {
      testing::Message::Message(&local_1e0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3b4f5d);
      testing::internal::AssertHelper::AssertHelper
                (&local_1e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x369,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1e8,&local_1e0);
      testing::internal::AssertHelper::~AssertHelper(&local_1e8);
      testing::Message::~Message((Message *)0x3b4fc0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b5015);
    if (local_14 == 0) {
      testing::internal::CmpHelperSTREQ((internal *)&local_1f8,"\"\"","tree_str","",local_1c0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1f8);
      if (!bVar1) {
        testing::Message::Message(&local_200);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3b50b8);
        testing::internal::AssertHelper::AssertHelper
                  (&local_208,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x36b,pcVar3);
        testing::internal::AssertHelper::operator=(&local_208,&local_200);
        testing::internal::AssertHelper::~AssertHelper(&local_208);
        testing::Message::~Message((Message *)0x3b5115);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b516a);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffffbf8);
      local_1c0 = (char *)0x0;
    }
    local_20c = CfdFreeTaprootScriptTreeHandle
                          ((void *)CONCAT17(uVar2,in_stack_fffffffffffffca8),pAVar4);
    local_224 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffc08,
               (char *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
               (CfdErrorCode *)in_stack_fffffffffffffbf8,(int *)in_stack_fffffffffffffbf0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_220);
    if (!bVar1) {
      testing::Message::Message(&local_230);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3b5242);
      testing::internal::AssertHelper::AssertHelper
                (&local_238,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x371,pcVar3);
      testing::internal::AssertHelper::operator=(&local_238,&local_230);
      testing::internal::AssertHelper::~AssertHelper(&local_238);
      testing::Message::~Message((Message *)0x3b529f);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b52f4);
  }
  local_14 = CfdGetLastErrorCode(in_stack_fffffffffffffc28);
  if (local_14 != 0) {
    local_240 = (char *)0x0;
    local_14 = CfdGetLastErrorMessage(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
    local_254 = 0;
    pAVar4 = &local_250;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffffc08,
               (char *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
               (CfdErrorCode *)in_stack_fffffffffffffbf8,(int *)in_stack_fffffffffffffbf0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
    if (!bVar1) {
      testing::Message::Message(&local_260);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3b53e1);
      testing::internal::AssertHelper::AssertHelper
                (&local_268,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x378,pcVar3);
      testing::internal::AssertHelper::operator=(&local_268,&local_260);
      testing::internal::AssertHelper::~AssertHelper(&local_268);
      testing::Message::~Message((Message *)0x3b543e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b5493);
    testing::internal::CmpHelperSTREQ((internal *)&local_278,"\"\"","str_buffer","",local_240);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_278);
    if (!bVar1) {
      testing::Message::Message(&local_280);
      in_stack_fffffffffffffc08 =
           (void **)testing::AssertionResult::failure_message((AssertionResult *)0x3b5528);
      testing::internal::AssertHelper::AssertHelper
                (&local_288,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x379,(char *)in_stack_fffffffffffffc08);
      testing::internal::AssertHelper::operator=(&local_288,&local_280);
      testing::internal::AssertHelper::~AssertHelper(&local_288);
      testing::Message::~Message((Message *)0x3b5585);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b55da);
    CfdFreeStringBuffer((char *)in_stack_fffffffffffffbf8);
    local_240 = (char *)0x0;
  }
  local_14 = CfdFreeHandle(in_stack_fffffffffffffbf8);
  local_29c = 0;
  pAVar4 = &local_298;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffc08,
             (char *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
             (CfdErrorCode *)pAVar4,(int *)in_stack_fffffffffffffbf0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
  if (!bVar1) {
    testing::Message::Message(&local_2a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3b56aa);
    testing::internal::AssertHelper::AssertHelper
              (&local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
               ,0x37f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2b0,&local_2a8);
    testing::internal::AssertHelper::~AssertHelper(&local_2b0);
    testing::Message::~Message((Message *)0x3b5707);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b575c);
  return;
}

Assistant:

TEST(cfdcapi_script, SingleKeyTaproot) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  void* tree_handle = nullptr;
  ret = CfdInitializeTaprootScriptTree(handle, &tree_handle);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    // set empty branch. or not set.
    // ret = CfdSetInitialTapBranchByHash(handle, tree_handle, "");
    // EXPECT_EQ(kCfdSuccess, ret);

    char* witness_program = nullptr;
    char* leaf_hash = nullptr;
    char* control_block = nullptr;
    ret = CfdGetTaprootScriptTreeHash(handle, tree_handle,
        "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
        &witness_program,
        &leaf_hash,
        &control_block);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(
        "cc3b1538e0c8144375f71e848b12d609d743992fddfc60dd6ca9b33b8392f27a",
        witness_program);
      EXPECT_EQ(nullptr, leaf_hash);  // current is tapbranch only.
      EXPECT_STREQ(
        "c11777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
        control_block);
      CfdFreeStringBuffer(witness_program);
      witness_program = nullptr;
      CfdFreeStringBuffer(leaf_hash);
      leaf_hash = nullptr;
      CfdFreeStringBuffer(control_block);
      control_block = nullptr;
    }

    char* tweaked_privkey = nullptr;
    ret = CfdGetTaprootTweakedPrivkey(handle, tree_handle,
        "305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27",
        &tweaked_privkey);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(
          "3a56ec9129732312a78db4b845138a3180c102621d7381ae6e6a5d530f14856a",
          tweaked_privkey);
      CfdFreeStringBuffer(tweaked_privkey);
      tweaked_privkey = nullptr;
    }

    char* tree_str = nullptr;
    ret = CfdGetTaprootScriptTreeSrting(handle, tree_handle, &tree_str);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("", tree_str);  // empty tapbranch
      CfdFreeStringBuffer(tree_str);
      tree_str = nullptr;
    }

    int tmp_ret = CfdFreeTaprootScriptTreeHandle(handle, tree_handle);
    EXPECT_EQ(kCfdSuccess, tmp_ret);
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}